

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamWriterPrivate::~QXmlStreamWriterPrivate(QXmlStreamWriterPrivate *this)

{
  long *plVar1;
  QXmlStreamPrivateTagStack *in_RDI;
  
  if ((((ulong)in_RDI[1].tagStackStringStorage.d.d & 1) != 0) &&
     (plVar1 = (long *)in_RDI[1].namespaceDeclarations.tos, plVar1 != (long *)0x0)) {
    (**(code **)(*plVar1 + 0x20))();
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  QXmlStreamPrivateTagStack::~QXmlStreamPrivateTagStack(in_RDI);
  return;
}

Assistant:

~QXmlStreamWriterPrivate() {
        if (deleteDevice)
            delete device;
    }